

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_8::setUniform
               (Functions *gl,deUint32 programID,char *name,float *value,int arraySize)

{
  GLenum err;
  char *msg;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GLint local_30;
  GLsizei local_2c;
  int loc;
  int arraySize_local;
  float *value_local;
  char *name_local;
  Functions *pFStack_10;
  deUint32 programID_local;
  Functions *gl_local;
  
  local_2c = arraySize;
  _loc = value;
  value_local = (float *)name;
  name_local._4_4_ = programID;
  pFStack_10 = gl;
  local_30 = (*gl->getUniformLocation)(programID,name);
  (*pFStack_10->uniform1fv)(local_30,local_2c,_loc);
  err = (*pFStack_10->getError)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Failed to set ",&local_71)
  ;
  std::operator+(&local_50,&local_70,(char *)value_local);
  msg = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderStructTests.cpp"
                  ,0x4bb);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void setUniform (const glw::Functions& gl, deUint32 programID, const char* name, const float* value, int arraySize)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1fv(loc, arraySize, value);
	CHECK_SET_UNIFORM(name);
}